

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

int __thiscall
CVmObjFile::getp_packBytes(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  char *pcVar1;
  long lVar2;
  vm_datatype_t *pvVar3;
  vm_val_t *pvVar4;
  int iVar5;
  int iVar6;
  uint argc;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_packBytes();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,oargc,&getp_packBytes::desc);
  if (iVar5 == 0) {
    check_raw_write(this);
    pvVar4 = sp_;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar4->val).obj = self;
    iVar5 = (**(code **)(**(long **)((this->super_CVmObject).ext_ + 8) + 0x38))();
    pcVar1 = (this->super_CVmObject).ext_;
    lVar2 = *(long *)(pcVar1 + 0x20);
    if (lVar2 != 0) {
      iVar5 = iVar5 - (int)*(undefined8 *)(lVar2 + 8);
    }
    CVmPack::pack(1,argc,*(CVmDataSource **)(pcVar1 + 8));
    sp_ = sp_ + -(long)(int)(argc + 1);
    iVar6 = (**(code **)(**(long **)((this->super_CVmObject).ext_ + 8) + 0x38))();
    lVar2 = *(long *)((this->super_CVmObject).ext_ + 0x20);
    if (lVar2 != 0) {
      iVar6 = iVar6 - (int)*(undefined8 *)(lVar2 + 8);
    }
    retval->typ = VM_INT;
    (retval->val).obj = iVar6 - iVar5;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_packBytes(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check that the it's a valid file open with write access in "raw" mode */
    check_raw_write(vmg0_);

    /* save 'self' for gc protection */
    G_stk->push_obj(vmg_ self);

    /* remember the starting seek position */
    long start = get_pos(vmg0_);

    /* pack the arguments into our file data stream */
    CVmPack::pack(vmg_ 1, argc, get_ext()->fp);

    /* discard our gc protection and our arguments */
    G_stk->discard(argc + 1);

    /* return the number of bytes packed */
    retval->set_int(get_pos(vmg0_) - start);
    
    /* handled */
    return TRUE;
}